

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall CTape::produce(string *__return_storage_ptr__,CTape *this,string *phrase)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  string local_80;
  string local_50;
  ulong local_30;
  size_type i;
  string *local_20;
  string *phrase_local;
  CTape *this_local;
  string *result;
  
  i._7_1_ = 0;
  local_20 = phrase;
  phrase_local = (string *)this;
  this_local = (CTape *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_30 = 0; uVar1 = local_30, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    produce_letter_abi_cxx11_(&local_50,this,*pcVar3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  optimize(&local_80,this,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string produce(const std::string& phrase)
        {
            std::string result;
            for (std::string::size_type i = 0; i < phrase.size(); ++i)
            {
                result += produce_letter(phrase[i]);
            }
            result = optimize(result);
            return result;
        }